

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_rp_pack_rects(nk_rp_context *context,nk_rp_rect *rects,int num_rects)

{
  nk_rp_node **ppnVar1;
  ushort uVar2;
  ushort uVar3;
  nk_rp_node *pnVar4;
  nk_rp_node *pnVar5;
  nk_rp_context *pnVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  nk_rp_node **ppnVar10;
  long lVar11;
  int *piVar12;
  nk_rp_node *pnVar13;
  int iVar14;
  uint uVar15;
  nk_rp_node **ppnVar16;
  nk_rp_context *pnVar17;
  int *pwaste;
  ulong uVar18;
  nk_rp_context *pnVar19;
  int iVar20;
  uint local_8c;
  uint local_88;
  int local_84;
  nk_rp_node **local_80;
  int local_60;
  int waste;
  nk_rp_rect *local_58;
  ulong local_50;
  ulong local_48;
  nk_rp_rect *local_40;
  ulong local_38;
  
  pwaste = (int *)(ulong)(uint)num_rects;
  uVar9 = 0;
  uVar18 = 0;
  if (0 < num_rects) {
    uVar18 = (ulong)(uint)num_rects;
  }
  piVar12 = &rects->was_packed;
  for (; uVar18 != uVar9; uVar9 = uVar9 + 1) {
    *piVar12 = (int)uVar9;
    piVar12 = piVar12 + 4;
  }
  nk_rp_qsort(rects,num_rects,nk_rect_height_compare);
  ppnVar1 = &context->active_head;
  uVar9 = 0;
  local_48 = uVar18;
  local_40 = rects;
  do {
    if (uVar9 == uVar18) {
      nk_rp_qsort(rects,num_rects,nk_rect_original_order);
      for (lVar11 = 0; uVar18 * 0x10 != lVar11; lVar11 = lVar11 + 0x10) {
        uVar15 = 1;
        if (*(short *)((long)&rects->x + lVar11) == -1) {
          uVar15 = (uint)(*(short *)((long)&rects->y + lVar11) != -1);
        }
        *(uint *)((long)&rects->was_packed + lVar11) = uVar15;
      }
      return;
    }
    local_38 = (ulong)rects[uVar9].w;
    iVar14 = context->align;
    iVar20 = (uint)rects[uVar9].w + iVar14 + -1;
    iVar20 = iVar20 - iVar20 % iVar14;
    local_50 = uVar9;
    if (iVar20 % iVar14 != 0) {
      __assert_fail("width % c->align == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                    ,0x244c,
                    "struct nk_rp__findresult nk_rp__skyline_find_best_pos(struct nk_rp_context *, int, int)"
                   );
    }
    local_58 = rects + uVar9;
    uVar2 = rects[uVar9].h;
    local_8c = 0x40000000;
    local_80 = (nk_rp_node **)0x0;
    local_84 = 0x40000000;
    ppnVar16 = ppnVar1;
    pnVar17 = (nk_rp_context *)*ppnVar1;
    while( true ) {
      uVar3 = (ushort)pnVar17->width;
      uVar15 = (uint)uVar2;
      if (context->width < (int)((uint)uVar3 + iVar20)) break;
      uVar7 = nk_rp__skyline_find_min_y
                        (pnVar17,(nk_rp_node *)(ulong)uVar3,iVar20,(int)&waste,pwaste);
      if (context->heuristic == 0) {
        if ((int)uVar7 < (int)local_8c) {
          local_8c = uVar7;
          local_80 = ppnVar16;
        }
      }
      else if (((int)(uVar15 + uVar7) <= context->height) &&
              (((int)uVar7 < (int)local_8c || (waste < local_84 && uVar7 == local_8c)))) {
        local_84 = waste;
        local_8c = uVar7;
        local_80 = ppnVar16;
      }
      ppnVar16 = (nk_rp_node **)&pnVar17->align;
      pnVar17 = *(nk_rp_context **)&pnVar17->align;
    }
    if (local_80 == (nk_rp_node **)0x0) {
      local_88 = 0;
    }
    else {
      local_88 = (uint)(*local_80)->x;
    }
    if (context->heuristic == 1) {
      pnVar17 = (nk_rp_context *)*ppnVar1;
      pnVar19 = pnVar17;
      while (ppnVar16 = ppnVar1, (int)(uint)(ushort)pnVar19->width < iVar20) {
        pnVar19 = *(nk_rp_context **)&pnVar19->align;
      }
      for (; uVar18 = local_48, rects = local_40, pnVar19 != (nk_rp_context *)0x0;
          pnVar19 = *(nk_rp_context **)&pnVar19->align) {
        uVar7 = (uint)(ushort)pnVar19->width - iVar20;
        pnVar6 = pnVar17;
        if ((int)uVar7 < 0) {
          __assert_fail("xpos >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                        ,0x2486,
                        "struct nk_rp__findresult nk_rp__skyline_find_best_pos(struct nk_rp_context *, int, int)"
                       );
        }
        do {
          pnVar17 = pnVar6;
          ppnVar10 = ppnVar16;
          ppnVar16 = (nk_rp_node **)&pnVar17->align;
          pnVar6 = *(nk_rp_context **)&pnVar17->align;
        } while ((ushort)(*(nk_rp_context **)&pnVar17->align)->width <= uVar7);
        if (uVar7 < (ushort)pnVar17->width) {
          __assert_fail("node->next->x > xpos && node->x <= xpos",
                        "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                        ,0x248c,
                        "struct nk_rp__findresult nk_rp__skyline_find_best_pos(struct nk_rp_context *, int, int)"
                       );
        }
        uVar8 = nk_rp__skyline_find_min_y
                          (pnVar17,(nk_rp_node *)(ulong)uVar7,iVar20,(int)&local_60,pwaste);
        if ((((int)(uVar15 + uVar8) < context->height) && ((int)uVar8 <= (int)local_8c)) &&
           (((uVar8 < local_8c || (local_60 < local_84)) ||
            ((local_60 == local_84 && ((int)uVar7 < (int)local_88)))))) {
          local_84 = local_60;
          local_8c = uVar8;
          local_88 = uVar7;
          local_80 = ppnVar10;
        }
        ppnVar16 = ppnVar10;
      }
    }
    if (((local_80 == (nk_rp_node **)0x0) || (context->height < (int)(uVar15 + local_8c))) ||
       (pnVar4 = context->free_head, pnVar4 == (nk_rp_node *)0x0)) {
      local_58->x = 0xffff;
      local_58->y = 0xffff;
    }
    else {
      pnVar4->x = (nk_rp_coord)local_88;
      pnVar4->y = (nk_rp_coord)(uVar15 + local_8c);
      context->free_head = pnVar4->next;
      pnVar5 = *local_80;
      pnVar13 = pnVar5;
      if ((int)(uint)pnVar5->x < (int)local_88) {
        pnVar13 = pnVar5->next;
        local_80 = &pnVar5->next;
      }
      *local_80 = pnVar4;
      iVar14 = local_88 + (int)local_38;
      while ((pnVar5 = pnVar13->next, pnVar5 != (nk_rp_node *)0x0 &&
             ((int)(uint)pnVar5->x <= iVar14))) {
        pnVar13->next = context->free_head;
        context->free_head = pnVar13;
        pnVar13 = pnVar5;
      }
      pnVar4->next = pnVar13;
      if ((int)(uint)pnVar13->x < iVar14) {
        pnVar13->x = (nk_rp_coord)iVar14;
      }
      local_58->x = (nk_rp_coord)local_88;
      local_58->y = (nk_rp_coord)local_8c;
    }
    uVar9 = local_50 + 1;
  } while( true );
}

Assistant:

NK_INTERN void
nk_rp_pack_rects(struct nk_rp_context *context, struct nk_rp_rect *rects, int num_rects)
{
    int i;
    /* we use the 'was_packed' field internally to allow sorting/unsorting */
    for (i=0; i < num_rects; ++i) {
        rects[i].was_packed = i;
    }

    /* sort according to heuristic */
    nk_rp_qsort(rects, (unsigned)num_rects, nk_rect_height_compare);

    for (i=0; i < num_rects; ++i) {
        struct nk_rp__findresult fr = nk_rp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
        if (fr.prev_link) {
            rects[i].x = (nk_rp_coord) fr.x;
            rects[i].y = (nk_rp_coord) fr.y;
        } else {
            rects[i].x = rects[i].y = NK_RP__MAXVAL;
        }
    }

    /* unsort */
    nk_rp_qsort(rects, (unsigned)num_rects, nk_rect_original_order);

    /* set was_packed flags */
    for (i=0; i < num_rects; ++i)
        rects[i].was_packed = !(rects[i].x == NK_RP__MAXVAL && rects[i].y == NK_RP__MAXVAL);
}